

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetMaxEFailGrowth(void *arkode_mem,sunrealtype etamxf)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_18;
  ARKodeHAdaptMem local_10;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetMaxEFailGrowth",&local_18,&local_10);
  if (iVar1 == 0) {
    if (local_18->step_supports_adaptive == 0) {
      iVar1 = -0x30;
      arkProcessError(local_18,-0x30,0x712,"ARKodeSetMaxEFailGrowth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
    }
    else {
      if ((etamxf <= 0.0) || (1.0 < etamxf)) {
        local_10->etamxf = 0.3;
      }
      else {
        local_10->etamxf = etamxf;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetMaxEFailGrowth(void* arkode_mem, sunrealtype etamxf)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* if argument legal set it, otherwise set default */
  if ((etamxf <= ZERO) || (etamxf > ONE)) { hadapt_mem->etamxf = ETAMXF; }
  else { hadapt_mem->etamxf = etamxf; }

  return (ARK_SUCCESS);
}